

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_eval.cc
# Opt level: O1

void EXPLORE_EVAL::do_actual_learning<true>(explore_eval *data,multi_learner *base,multi_ex *ec_seq)

{
  action_score *paVar1;
  pointer ppeVar2;
  example *peVar3;
  wclass *pwVar4;
  label_t lVar5;
  cb_class *pcVar6;
  size_t sVar7;
  cb_class *pcVar8;
  example **ec;
  example *peVar9;
  pointer ppeVar10;
  long lVar11;
  long lVar12;
  multi_ex *__range4;
  float fVar13;
  float fVar14;
  float fVar15;
  cb_class cVar16;
  
  peVar9 = CB_EXPLORE_ADF::test_adf_sequence(ec_seq);
  if (peVar9 != (example *)0x0) {
    lVar5 = (peVar9->l).multi;
    pcVar6 = (cb_class *)(peVar9->l).cs.costs._end;
    sVar7 = (peVar9->l).cs.costs.erase_count;
    (data->action_label).costs.end_array = (cb_class *)(peVar9->l).cs.costs.end_array;
    (data->action_label).costs.erase_count = sVar7;
    (data->action_label).costs._begin = (cb_class *)lVar5;
    (data->action_label).costs._end = pcVar6;
    pcVar6 = (data->empty_label).costs._end;
    pcVar8 = (data->empty_label).costs.end_array;
    sVar7 = (data->empty_label).costs.erase_count;
    (peVar9->l).multi = (label_t)(data->empty_label).costs._begin;
    (peVar9->l).cs.costs._end = (wclass *)pcVar6;
    (peVar9->l).cs.costs.end_array = (wclass *)pcVar8;
    (peVar9->l).cs.costs.erase_count = sVar7;
  }
  LEARNER::multiline_learn_or_predict<false>(base,ec_seq,data->offset,0);
  if (peVar9 != (example *)0x0) {
    lVar5 = (label_t)(data->action_label).costs._begin;
    pcVar6 = (data->action_label).costs._end;
    sVar7 = (data->action_label).costs.erase_count;
    (peVar9->l).cs.costs.end_array = (wclass *)(data->action_label).costs.end_array;
    (peVar9->l).cs.costs.erase_count = sVar7;
    (peVar9->l).multi = lVar5;
    (peVar9->l).cs.costs._end = (wclass *)pcVar6;
  }
  cVar16 = CB_ADF::get_observed_cost(ec_seq);
  (data->known_cost).cost = (float)(int)cVar16._0_8_;
  (data->known_cost).action = (int)((ulong)cVar16._0_8_ >> 0x20);
  (data->known_cost).probability = (float)(int)cVar16._8_8_;
  (data->known_cost).partial_prediction = (float)(int)((ulong)cVar16._8_8_ >> 0x20);
  if (peVar9 != (example *)0x0) {
    peVar9 = *(ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    paVar1 = (peVar9->pred).a_s._begin;
    lVar11 = (long)(peVar9->pred).scalars._end - (long)paVar1;
    if (lVar11 == 0) {
      fVar13 = 0.0;
    }
    else {
      lVar11 = lVar11 >> 3;
      fVar13 = 0.0;
      lVar12 = 0;
      do {
        if ((data->known_cost).action == paVar1[lVar12].action) {
          fVar13 = paVar1[lVar12].score;
        }
        lVar12 = lVar12 + 1;
      } while (lVar11 + (ulong)(lVar11 == 0) != lVar12);
    }
    fVar15 = fVar13 / (data->known_cost).probability;
    if (data->fixed_multiplier == false) {
      fVar14 = 1.0 / fVar15;
      if (data->multiplier <= 1.0 / fVar15) {
        fVar14 = data->multiplier;
      }
      data->multiplier = fVar14;
    }
    else {
      fVar15 = fVar15 * data->multiplier;
    }
    if (1.000001 < fVar15) {
      data->violations = data->violations + 1;
    }
    fVar14 = merand48(&data->all->random_state);
    if (fVar14 < fVar15) {
      ppeVar2 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      peVar9 = (example *)0x0;
      for (ppeVar10 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                      super__Vector_impl_data._M_start; ppeVar10 != ppeVar2; ppeVar10 = ppeVar10 + 1
          ) {
        peVar3 = *ppeVar10;
        pwVar4 = (peVar3->l).cs.costs._begin;
        if (((long)(peVar3->l).cs.costs._end - (long)pwVar4 == 0x10) &&
           (((pwVar4->x != 3.4028235e+38 || (NAN(pwVar4->x))) && (0.0 < pwVar4->partial_prediction))
           )) {
          peVar9 = peVar3;
        }
        if (1.0 < fVar15) {
          peVar3->weight = peVar3->weight * fVar15;
        }
      }
      ((peVar9->l).cs.costs._begin)->partial_prediction = fVar13;
      LEARNER::multiline_learn_or_predict<true>(base,ec_seq,data->offset,0);
      if (1.0 < fVar15) {
        ppeVar10 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        ppeVar2 = (ec_seq->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        if (ppeVar10 != ppeVar2) {
          do {
            (*ppeVar10)->weight = (*ppeVar10)->weight * (1.0 / fVar15);
            ppeVar10 = ppeVar10 + 1;
          } while (ppeVar10 != ppeVar2);
        }
      }
      ((peVar9->l).cs.costs._begin)->partial_prediction = (data->known_cost).probability;
      data->update_count = data->update_count + 1;
    }
  }
  return;
}

Assistant:

void do_actual_learning(explore_eval& data, multi_learner& base, multi_ex& ec_seq)
{
  example* label_example = CB_EXPLORE_ADF::test_adf_sequence(ec_seq);

  if (label_example != nullptr)  // extract label
  {
    data.action_label = label_example->l.cb;
    label_example->l.cb = data.empty_label;
  }
  multiline_learn_or_predict<false>(base, ec_seq, data.offset);

  if (label_example != nullptr)  // restore label
    label_example->l.cb = data.action_label;

  data.known_cost = CB_ADF::get_observed_cost(ec_seq);
  if (label_example != nullptr && is_learn)
  {
    ACTION_SCORE::action_scores& a_s = ec_seq[0]->pred.a_s;

    float action_probability = 0;
    for (size_t i = 0; i < a_s.size(); i++)
      if (data.known_cost.action == a_s[i].action)
        action_probability = a_s[i].score;

    float threshold = action_probability / data.known_cost.probability;

    if (!data.fixed_multiplier)
      data.multiplier = min(data.multiplier, 1 / threshold);
    else
      threshold *= data.multiplier;

    if (threshold > 1. + 1e-6)
      data.violations++;

    if (merand48(data.all->random_state) < threshold)
    {
      example* ec_found = nullptr;
      for (example*& ec : ec_seq)
      {
        if (ec->l.cb.costs.size() == 1 && ec->l.cb.costs[0].cost != FLT_MAX && ec->l.cb.costs[0].probability > 0)
          ec_found = ec;
        if (threshold > 1)
          ec->weight *= threshold;
      }
      ec_found->l.cb.costs[0].probability = action_probability;

      multiline_learn_or_predict<true>(base, ec_seq, data.offset);

      if (threshold > 1)
      {
        float inv_threshold = 1.f / threshold;
        for (auto& ec : ec_seq) ec->weight *= inv_threshold;
      }
      ec_found->l.cb.costs[0].probability = data.known_cost.probability;
      data.update_count++;
    }
  }
}